

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_ecmult_multi_simple_var
              (secp256k1_gej *r,secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,
              void *cbdata,size_t n_points)

{
  int extraout_EAX;
  long lVar1;
  secp256k1_gej *r_00;
  secp256k1_ecmult_multi_callback *psVar2;
  long lVar3;
  secp256k1_ecmult_multi_callback *psVar4;
  secp256k1_ge *psVar5;
  ecmult_multi_data *data;
  byte bVar6;
  secp256k1_scalar scalar;
  secp256k1_gej pointj;
  secp256k1_gej tmpj;
  secp256k1_fe aux [4];
  secp256k1_ge point;
  secp256k1_ge pre_a [4];
  secp256k1_strauss_point_state ps [1];
  secp256k1_scalar local_864;
  secp256k1_strauss_state local_860;
  secp256k1_gej local_848;
  secp256k1_gej local_7b0;
  secp256k1_fe local_718 [4];
  secp256k1_ge local_650;
  secp256k1_ge local_5e8 [4];
  secp256k1_strauss_point_state local_448;
  
  bVar6 = 0;
  secp256k1_gej_set_infinity(r);
  secp256k1_gej_set_infinity(&local_7b0);
  local_848.x.n[0] = (uint64_t)local_718;
  local_848.x.n[1] = (uint64_t)local_5e8;
  local_848.x.n[2] = (uint64_t)&local_448;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&local_848,r,1,&local_7b0,&secp256k1_scalar_zero,inp_g_sc);
  lVar3 = 2;
  psVar2 = cb;
  do {
    local_864 = *(secp256k1_scalar *)psVar2;
    psVar4 = cb + lVar3 * 4;
    psVar5 = &local_650;
    for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
      (psVar5->x).n[0] = *(uint64_t *)psVar4;
      psVar4 = psVar4 + (ulong)bVar6 * -0x10 + 8;
      psVar5 = (secp256k1_ge *)((long)psVar5 + (ulong)bVar6 * -0x10 + 8);
    }
    r_00 = &local_848;
    secp256k1_gej_set_ge(r_00,&local_650);
    local_860.aux = local_718;
    local_860.pre_a = local_5e8;
    local_860.ps = &local_448;
    secp256k1_ecmult_strauss_wnaf(&local_860,&local_7b0,1,r_00,&local_864,(secp256k1_scalar *)0x0);
    secp256k1_gej_add_var(r,r,&local_7b0,&r_00->x);
    lVar3 = lVar3 + 0x1a;
    psVar2 = psVar2 + 4;
  } while (lVar3 == 0x1c);
  return extraout_EAX;
}

Assistant:

static int secp256k1_ecmult_multi_simple_var(secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points) {
    size_t point_idx;
    secp256k1_gej tmpj;

    secp256k1_gej_set_infinity(r);
    secp256k1_gej_set_infinity(&tmpj);
    /* r = inp_g_sc*G */
    secp256k1_ecmult(r, &tmpj, &secp256k1_scalar_zero, inp_g_sc);
    for (point_idx = 0; point_idx < n_points; point_idx++) {
        secp256k1_ge point;
        secp256k1_gej pointj;
        secp256k1_scalar scalar;
        if (!cb(&scalar, &point, point_idx, cbdata)) {
            return 0;
        }
        /* r += scalar*point */
        secp256k1_gej_set_ge(&pointj, &point);
        secp256k1_ecmult(&tmpj, &pointj, &scalar, NULL);
        secp256k1_gej_add_var(r, r, &tmpj, NULL);
    }
    return 1;
}